

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

void Sfm_NtkUpdateLevel_rec(Sfm_Ntk_t *p,int iNode)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vArray;
  Vec_Int_t *pVVar3;
  
  vArray = Vec_WecEntry(&p->vFanins,iNode);
  pVVar3 = &p->vLevels;
  iVar1 = Sfm_ObjAddsLevel(p,iNode);
  iVar1 = Sfm_ObjLevelNew(vArray,pVVar3,iVar1);
  iVar2 = Vec_IntEntry(pVVar3,iNode);
  if (iVar1 != iVar2) {
    Vec_IntWriteEntry(pVVar3,iNode,iVar1);
    iVar1 = 0;
    while( true ) {
      iVar2 = Sfm_ObjFanoutNum(p,iNode);
      if (iVar2 <= iVar1) break;
      pVVar3 = Vec_WecEntry(&p->vFanouts,iNode);
      iVar2 = Vec_IntEntry(pVVar3,iVar1);
      Sfm_NtkUpdateLevel_rec(p,iVar2);
      iVar1 = iVar1 + 1;
    }
  }
  return;
}

Assistant:

void Sfm_NtkUpdateLevel_rec( Sfm_Ntk_t * p, int iNode )
{
    int i, iFanout;
    int LevelNew = Sfm_ObjLevelNew( Sfm_ObjFiArray(p, iNode), &p->vLevels, Sfm_ObjAddsLevel(p, iNode) );
    if ( LevelNew == Sfm_ObjLevel(p, iNode) )
        return;
    Sfm_ObjSetLevel( p, iNode, LevelNew );
    Sfm_ObjForEachFanout( p, iNode, iFanout, i )
        Sfm_NtkUpdateLevel_rec( p, iFanout );
}